

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<2,_10,_12>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  int i;
  float *pfVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  float *pfVar6;
  long lVar7;
  undefined4 uVar8;
  Vector<float,_3> res_1;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Type in1;
  Type in0;
  Vec4 *local_120;
  ulong local_118;
  float local_110 [6];
  float local_f8 [4];
  float local_e8 [6];
  float local_d0 [3];
  float local_c4 [3];
  Matrix<float,_3,_4> local_b8;
  Matrix<float,_4,_3> local_88;
  Matrix<float,_4,_4> local_50;
  
  pfVar2 = (float *)&local_88;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar7 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar3 != lVar7) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar7) = uVar8;
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x30);
      lVar5 = lVar5 + 1;
      pfVar2 = pfVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar5 != 4);
    local_88.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_88.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_88.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_88.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_88.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_88.m_data.m_data[2].m_data._8_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  }
  else {
    local_88.m_data.m_data[2].m_data[0] = 0.0;
    local_88.m_data.m_data[2].m_data[1] = 0.0;
    local_88.m_data.m_data[2].m_data[2] = 0.0;
    local_88.m_data.m_data[2].m_data[3] = 0.0;
    local_88.m_data.m_data[1].m_data[0] = 0.0;
    local_88.m_data.m_data[1].m_data[1] = 0.0;
    local_88.m_data.m_data[1].m_data[2] = 0.0;
    local_88.m_data.m_data[1].m_data[3] = 0.0;
    local_88.m_data.m_data[0].m_data[0] = 0.0;
    local_88.m_data.m_data[0].m_data[1] = 0.0;
    local_88.m_data.m_data[0].m_data[2] = 0.0;
    local_88.m_data.m_data[0].m_data[3] = 0.0;
    puVar4 = &sr::(anonymous_namespace)::s_constInMat3x4;
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        pfVar2[lVar5] = *(float *)((long)puVar4 + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0xc);
      lVar3 = lVar3 + 1;
      pfVar2 = pfVar2 + 1;
      puVar4 = puVar4 + 3;
    } while (lVar3 != 4);
  }
  pfVar2 = (float *)&local_b8;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar7 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar3 != lVar7) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar7) = uVar8;
        lVar7 = lVar7 + 0xc;
      } while (lVar7 != 0x30);
      lVar5 = lVar5 + 1;
      pfVar2 = pfVar2 + 1;
      lVar3 = lVar3 + 0xc;
    } while (lVar5 != 3);
    local_b8.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_b8.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    local_b8.m_data.m_data[1].m_data[2] = evalCtx->in[1].m_data[2];
    local_b8.m_data.m_data[1].m_data[0] = (float)uVar1;
    local_b8.m_data.m_data[1].m_data[1] = (float)((ulong)uVar1 >> 0x20);
    local_b8.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_b8.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[3].m_data;
    local_b8.m_data.m_data[3].m_data[2] = evalCtx->in[3].m_data[2];
    local_b8.m_data.m_data[3].m_data[0] = (float)uVar1;
    local_b8.m_data.m_data[3].m_data[1] = (float)((ulong)uVar1 >> 0x20);
  }
  else {
    local_b8.m_data.m_data[2].m_data[2] = 0.0;
    local_b8.m_data.m_data[3].m_data[0] = 0.0;
    local_b8.m_data.m_data[3].m_data[1] = 0.0;
    local_b8.m_data.m_data[3].m_data[2] = 0.0;
    local_b8.m_data.m_data[1].m_data[1] = 0.0;
    local_b8.m_data.m_data[1].m_data[2] = 0.0;
    local_b8.m_data.m_data[2].m_data[0] = 0.0;
    local_b8.m_data.m_data[2].m_data[1] = 0.0;
    local_b8.m_data.m_data[0].m_data[0] = 0.0;
    local_b8.m_data.m_data[0].m_data[1] = 0.0;
    local_b8.m_data.m_data[0].m_data[2] = 0.0;
    local_b8.m_data.m_data[1].m_data[0] = 0.0;
    puVar4 = &DAT_00b4c450;
    lVar3 = 0;
    do {
      lVar5 = 0;
      pfVar6 = pfVar2;
      do {
        *pfVar6 = (float)puVar4[lVar5];
        lVar5 = lVar5 + 1;
        pfVar6 = pfVar6 + 3;
      } while (lVar5 != 4);
      lVar3 = lVar3 + 1;
      pfVar2 = pfVar2 + 1;
      puVar4 = puVar4 + 4;
    } while (lVar3 != 3);
  }
  tcu::operator*(&local_50,&local_88,&local_b8);
  local_c4[0] = local_50.m_data.m_data[0].m_data[0];
  local_c4[1] = local_50.m_data.m_data[0].m_data[1];
  local_c4[2] = local_50.m_data.m_data[0].m_data[2];
  local_d0[0] = local_50.m_data.m_data[1].m_data[1];
  local_d0[1] = local_50.m_data.m_data[1].m_data[2];
  local_d0[2] = local_50.m_data.m_data[1].m_data[3];
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  local_f8[2] = 0.0;
  lVar3 = 0;
  do {
    local_f8[lVar3] = local_e8[lVar3 + 9] + local_e8[lVar3 + 6];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_e8[3] = local_50.m_data.m_data[2].m_data[2];
  local_e8[4] = local_50.m_data.m_data[2].m_data[3];
  local_e8[5] = local_50.m_data.m_data[2].m_data[0];
  local_120 = (Vec4 *)0x0;
  local_118 = local_118 & 0xffffffff00000000;
  lVar3 = 0;
  do {
    *(float *)((long)&local_120 + lVar3 * 4) = local_f8[lVar3] + local_e8[lVar3 + 3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_e8[0] = local_50.m_data.m_data[3].m_data[3];
  local_e8[1] = local_50.m_data.m_data[3].m_data[0];
  local_e8[2] = local_50.m_data.m_data[3].m_data[1];
  local_110[2] = 0.0;
  local_110[3] = 0.0;
  local_110[4] = 0.0;
  lVar3 = 0;
  do {
    local_110[lVar3 + 2] = *(float *)((long)&local_120 + lVar3 * 4) + local_e8[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_120 = &evalCtx->color;
  local_118 = 0x100000000;
  local_110[0] = 2.8026e-45;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_120 + lVar3 * 4)] = local_110[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}